

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_split_clients_module.c
# Opt level: O0

char * ngx_http_split_clients(ngx_conf_t *cf,ngx_command_t *dummy,void *conf)

{
  long *plVar1;
  undefined4 *puVar2;
  ngx_int_t nVar3;
  ngx_http_split_clients_part_t *part;
  ngx_http_split_clients_ctx_t *ctx;
  ngx_str_t *value;
  ngx_int_t n;
  void *conf_local;
  ngx_command_t *dummy_local;
  ngx_conf_t *cf_local;
  
  plVar1 = (long *)cf->args->elts;
  puVar2 = (undefined4 *)ngx_array_push((ngx_array_t *)((long)cf->ctx + 0x28));
  if (puVar2 == (undefined4 *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    if ((*plVar1 == 1) && (*(char *)plVar1[1] == '*')) {
      *puVar2 = 0;
    }
    else {
      if ((*plVar1 == 0) ||
         (((*(char *)(plVar1[1] + *plVar1 + -1) != '%' ||
           (nVar3 = ngx_atofp((u_char *)plVar1[1],*plVar1 - 1,2), nVar3 == -1)) || (nVar3 == 0)))) {
        ngx_conf_log_error(1,cf,0,"invalid percent value \"%V\"",plVar1);
        return (char *)0xffffffffffffffff;
      }
      *puVar2 = (int)nVar3;
    }
    puVar2[2] = puVar2[2] & 0xf0000000 | (uint)plVar1[2] & 0xfffffff;
    puVar2[2] = puVar2[2] & 0xefffffff | 0x10000000;
    puVar2[2] = puVar2[2] & 0xdfffffff;
    puVar2[2] = puVar2[2] & 0xbfffffff;
    *(long *)(puVar2 + 4) = plVar1[3];
    cf_local = (ngx_conf_t *)0x0;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_split_clients(ngx_conf_t *cf, ngx_command_t *dummy, void *conf)
{
    ngx_int_t                       n;
    ngx_str_t                      *value;
    ngx_http_split_clients_ctx_t   *ctx;
    ngx_http_split_clients_part_t  *part;

    ctx = cf->ctx;
    value = cf->args->elts;

    part = ngx_array_push(&ctx->parts);
    if (part == NULL) {
        return NGX_CONF_ERROR;
    }

    if (value[0].len == 1 && value[0].data[0] == '*') {
        part->percent = 0;

    } else {
        if (value[0].len == 0 || value[0].data[value[0].len - 1] != '%') {
            goto invalid;
        }

        n = ngx_atofp(value[0].data, value[0].len - 1, 2);
        if (n == NGX_ERROR || n == 0) {
            goto invalid;
        }

        part->percent = (uint32_t) n;
    }

    part->value.len = value[1].len;
    part->value.valid = 1;
    part->value.no_cacheable = 0;
    part->value.not_found = 0;
    part->value.data = value[1].data;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "invalid percent value \"%V\"", &value[0]);
    return NGX_CONF_ERROR;
}